

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveUpdateRight(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *vec,int *ridx,int n,
                   number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *eps)

{
  int iVar1;
  fpclass_type fVar2;
  int32_t iVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  bool bVar10;
  int *piVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  uint *puVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  long lVar18;
  byte bVar19;
  undefined8 uVar20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  undefined1 local_2f8 [32];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [13];
  undefined3 uStack_28b;
  int iStack_288;
  bool bStack_284;
  undefined8 local_280;
  int *local_278;
  pointer local_270;
  int *local_268;
  int *local_260;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_258;
  long local_250;
  int *local_248;
  long local_240;
  undefined1 local_238 [32];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [13];
  undefined3 uStack_1cb;
  int iStack_1c8;
  bool bStack_1c4;
  undefined8 local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [13];
  undefined3 uStack_14b;
  int iStack_148;
  bool bStack_144;
  undefined8 local_140;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar19 = 0;
  local_1c0._0_4_ = cpp_dec_float_finite;
  local_1c0._4_4_ = 0x1c;
  local_238._0_16_ = (undefined1  [16])0x0;
  local_238._16_16_ = (undefined1  [16])0x0;
  local_218 = (undefined1  [16])0x0;
  local_208 = (undefined1  [16])0x0;
  local_1f8 = (undefined1  [16])0x0;
  local_1e8 = (undefined1  [16])0x0;
  local_1d8 = SUB1613((undefined1  [16])0x0,0);
  uStack_1cb = 0;
  iStack_1c8 = 0;
  bStack_1c4 = false;
  iVar1 = (this->l).firstUnused;
  iVar6 = (this->l).firstUpdate;
  lVar18 = (long)iVar6;
  if (iVar6 < iVar1) {
    local_270 = (this->l).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_278 = (this->l).idx;
    local_260 = (this->l).row;
    local_268 = (this->l).start;
    local_258 = eps;
    local_248 = ridx;
    do {
      iVar6 = local_260[lVar18];
      pnVar12 = vec + iVar6;
      pcVar16 = &local_130;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pcVar16->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar19 * -2 + 1) * 4);
      }
      iVar7 = vec[iVar6].m_backend.exp;
      bVar10 = vec[iVar6].m_backend.neg;
      fVar2 = vec[iVar6].m_backend.fpclass;
      iVar3 = vec[iVar6].m_backend.prec_elem;
      pnVar12 = vec + iVar6;
      puVar14 = (uint *)local_2f8;
      local_130.exp = iVar7;
      local_130.neg = bVar10;
      local_130.fpclass = fVar2;
      local_130.prec_elem = iVar3;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar14 = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
        puVar14 = puVar14 + (ulong)bVar19 * -2 + 1;
      }
      pnVar12 = local_258;
      pcVar16 = &local_b0;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pcVar16->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar19 * -2 + 1) * 4);
      }
      local_b0.exp = (local_258->m_backend).exp;
      local_b0.neg = (local_258->m_backend).neg;
      local_b0.fpclass = (local_258->m_backend).fpclass;
      local_b0.prec_elem = (local_258->m_backend).prec_elem;
      local_280._4_4_ = iVar3;
      local_280._0_4_ = fVar2;
      bStack_284 = bVar10;
      if ((bVar10 == true) && (local_2f8._0_4_ != 0 || fVar2 != cpp_dec_float_finite)) {
        bStack_284 = false;
      }
      local_250 = lVar18;
      if ((local_b0.fpclass != cpp_dec_float_NaN && fVar2 != cpp_dec_float_NaN) &&
         (iStack_288 = iVar7,
         iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)local_2f8,&local_b0), 0 < iVar6)) {
        lVar9 = (long)local_268[lVar18];
        iVar6 = local_268[lVar18 + 1];
        if (local_268[lVar18] < iVar6) {
          pcVar16 = &local_270[lVar9].m_backend;
          piVar11 = local_278 + lVar9;
          local_240 = lVar9;
          do {
            iVar7 = *piVar11;
            local_248[n] = iVar7;
            pnVar12 = vec + iVar7;
            pnVar13 = pnVar12;
            puVar14 = (uint *)local_238;
            for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
              *puVar14 = (pnVar13->m_backend).data._M_elems[0];
              pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar13 + ((ulong)bVar19 * -2 + 1) * 4);
              puVar14 = puVar14 + (ulong)bVar19 * -2 + 1;
            }
            iStack_1c8 = vec[iVar7].m_backend.exp;
            bStack_1c4 = vec[iVar7].m_backend.neg;
            fVar4 = vec[iVar7].m_backend.fpclass;
            iVar5 = vec[iVar7].m_backend.prec_elem;
            local_1c0._0_4_ = fVar4;
            local_1c0._4_4_ = iVar5;
            uVar8 = 0;
            if (fVar4 != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_2f8,0,(type *)0x0);
              iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_238,
                                 (cpp_dec_float<200U,_int,_void> *)local_2f8);
              uVar8 = (uint)(iVar7 == 0);
            }
            local_140._0_4_ = cpp_dec_float_finite;
            local_140._4_4_ = 0x1c;
            local_1b8 = (undefined1  [16])0x0;
            local_1a8 = (undefined1  [16])0x0;
            local_198 = (undefined1  [16])0x0;
            local_188 = (undefined1  [16])0x0;
            local_178 = (undefined1  [16])0x0;
            local_168 = (undefined1  [16])0x0;
            local_158 = SUB1613((undefined1  [16])0x0,0);
            uStack_14b = 0;
            iStack_148 = 0;
            bStack_144 = false;
            pcVar15 = &local_130;
            if (pcVar16 != (cpp_dec_float<200U,_int,_void> *)local_1b8) {
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_1b8;
              for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
                (pcVar17->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
                pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar19 * -8 + 4)
                ;
                pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar19 * -8 + 4)
                ;
              }
              iStack_148 = local_130.exp;
              bStack_144 = local_130.neg;
              local_140._4_4_ = local_130.prec_elem;
              local_140._0_4_ = local_130.fpclass;
              pcVar15 = pcVar16;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      ((cpp_dec_float<200U,_int,_void> *)local_1b8,pcVar15);
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)local_238;
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_2f8;
            for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
              (pcVar17->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar19 * -8 + 4);
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar19 * -8 + 4);
            }
            iStack_288 = iStack_1c8;
            bStack_284 = bStack_1c4;
            local_280._0_4_ = (fpclass_type)local_1c0;
            local_280._4_4_ = local_1c0._4_4_;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_2f8,
                       (cpp_dec_float<200U,_int,_void> *)local_1b8);
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)local_2f8;
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_238;
            for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
              (pcVar17->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar19 * -8 + 4);
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar19 * -8 + 4);
            }
            iStack_1c8 = iStack_288;
            bStack_1c4 = bStack_284;
            local_1c0._0_4_ = (fpclass_type)local_280;
            local_1c0._4_4_ = local_280._4_4_;
            if ((fpclass_type)local_280 == cpp_dec_float_NaN) {
              uVar20._4_4_ = SUB84(local_280,4);
              uVar20._0_4_ = cpp_dec_float_NaN;
LAB_005357ab:
              bVar10 = bStack_1c4;
              iVar7 = iStack_1c8;
              puVar14 = (uint *)local_238;
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)local_2f8;
              for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
                (pcVar15->data)._M_elems[0] = *puVar14;
                puVar14 = puVar14 + (ulong)bVar19 * -2 + 1;
                pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar19 * -8 + 4)
                ;
              }
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_2f8,0,(type *)0x0);
              iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_238,
                                 (cpp_dec_float<200U,_int,_void> *)local_2f8);
              uVar20 = local_1c0;
              if (iVar7 != 0) goto LAB_005357ab;
              local_280._0_4_ = cpp_dec_float_finite;
              local_280._4_4_ = 0x1c;
              local_2f8._0_16_ = (undefined1  [16])0x0;
              local_2f8._16_16_ = (undefined1  [16])0x0;
              local_2d8 = (undefined1  [16])0x0;
              local_2c8 = (undefined1  [16])0x0;
              local_2b8 = (undefined1  [16])0x0;
              local_2a8 = (undefined1  [16])0x0;
              local_298 = SUB1613((undefined1  [16])0x0,0);
              uStack_28b = 0;
              iStack_288 = 0;
              bStack_284 = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)local_2f8,1e-100);
              iVar7 = iStack_288;
              bVar10 = bStack_284;
              uVar20 = local_280;
            }
            piVar11 = piVar11 + 1;
            n = n + uVar8;
            pcVar16 = pcVar16 + 1;
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)local_2f8;
            pnVar13 = pnVar12;
            for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
              (pnVar13->m_backend).data._M_elems[0] = (pcVar15->data)._M_elems[0];
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar19 * -8 + 4);
              pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar13 + ((ulong)bVar19 * -2 + 1) * 4);
            }
            (pnVar12->m_backend).exp = iVar7;
            (pnVar12->m_backend).neg = bVar10;
            (pnVar12->m_backend).fpclass = (fpclass_type)uVar20;
            (pnVar12->m_backend).prec_elem = SUB84(uVar20,4);
            iVar6 = iVar6 + -1;
          } while ((int)local_240 < iVar6);
        }
      }
      lVar18 = local_250 + 1;
    } while (iVar1 != (int)lVar18);
  }
  return n;
}

Assistant:

int CLUFactor<R>::vSolveUpdateRight(R* vec, int* ridx, int n, R eps)
{
   int i, j, k;
   int end;
   R x, y;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUnused;

   for(i = l.firstUpdate; i < end; ++i)
   {
      assert(i >= 0 && i < thedim);
      x = vec[lrow[i]];

      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            int m = ridx[n] = *idx++;
            assert(m >= 0 && m < thedim);
            y = vec[m];
            n += (y == 0) ? 1 : 0;
            y = y - x * (*val++);
            vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
         }
      }
   }

   return n;
}